

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Next
          (CopyingInputStreamAdaptor *this,void **data,int *size)

{
  uint uVar1;
  pointer __old_p;
  uchar *puVar2;
  int iVar3;
  
  if (this->failed_ != false) {
    return false;
  }
  puVar2 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar2 == (uchar *)0x0) {
    iVar3 = -1;
    if (-1 < this->buffer_size_) {
      iVar3 = this->buffer_size_;
    }
    puVar2 = (uchar *)operator_new__((long)iVar3);
    (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar2;
  }
  iVar3 = this->backup_bytes_;
  if ((long)iVar3 < 1) {
    uVar1 = (*this->copying_stream_->_vptr_CopyingInputStream[2])
                      (this->copying_stream_,puVar2,(ulong)(uint)this->buffer_size_);
    this->buffer_used_ = uVar1;
    if ((int)uVar1 < 1) {
      if ((int)uVar1 < 0) {
        this->failed_ = true;
      }
      FreeBuffer(this);
      return false;
    }
    this->position_ = this->position_ + (ulong)uVar1;
    *size = uVar1;
    *data = (this->buffer_)._M_t.
            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  else {
    *data = puVar2 + ((long)this->buffer_used_ - (long)iVar3);
    *size = iVar3;
    this->backup_bytes_ = 0;
  }
  return true;
}

Assistant:

bool CopyingInputStreamAdaptor::Next(const void** data, int* size) {
  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  AllocateBufferIfNeeded();

  if (backup_bytes_ > 0) {
    // We have data left over from a previous BackUp(), so just return that.
    *data = buffer_.get() + buffer_used_ - backup_bytes_;
    *size = backup_bytes_;
    backup_bytes_ = 0;
    return true;
  }

  // Read new data into the buffer.
  buffer_used_ = copying_stream_->Read(buffer_.get(), buffer_size_);
  if (buffer_used_ <= 0) {
    // EOF or read error.  We don't need the buffer anymore.
    if (buffer_used_ < 0) {
      // Read error (not EOF).
      failed_ = true;
    }
    FreeBuffer();
    return false;
  }
  position_ += buffer_used_;

  *size = buffer_used_;
  *data = buffer_.get();
  return true;
}